

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

bool __thiscall
Js::InlineCache::GetCallApplyTarget
          (InlineCache *this,RecyclableObject *obj,RecyclableObject **callee)

{
  bool bVar1;
  Type *pTVar2;
  DynamicObject *pDVar3;
  Var pvVar4;
  RecyclableObject *pRVar5;
  Var objectAtAuxSlot_1;
  Var objectAtInlineSlot_1;
  Var objectAtAuxSlot;
  Var objectAtInlineSlot;
  Type *taggedType;
  Type *type;
  RecyclableObject **callee_local;
  RecyclableObject *obj_local;
  InlineCache *this_local;
  
  pTVar2 = RecyclableObject::GetType(obj);
  *callee = (RecyclableObject *)0x0;
  bVar1 = IsLocal(this);
  if (bVar1) {
    if (pTVar2 == (this->u).local.type) {
      pDVar3 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      pvVar4 = DynamicObject::GetInlineSlot(pDVar3,(uint)(this->u).local.slotIndex);
      bVar1 = TaggedNumber::Is(pvVar4);
      if (!bVar1) {
        pRVar5 = VarTo<Js::RecyclableObject>(pvVar4);
        *callee = pRVar5;
        return true;
      }
    }
    else if ((Type *)((ulong)pTVar2 | 4) == (this->u).local.type) {
      pDVar3 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      pvVar4 = DynamicObject::GetAuxSlot(pDVar3,(uint)(this->u).local.slotIndex);
      bVar1 = TaggedNumber::Is(pvVar4);
      if (!bVar1) {
        pDVar3 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
        pvVar4 = DynamicObject::GetAuxSlot(pDVar3,(uint)(this->u).local.slotIndex);
        pRVar5 = VarTo<Js::RecyclableObject>(pvVar4);
        *callee = pRVar5;
        return true;
      }
    }
  }
  else {
    bVar1 = IsProto(this);
    if (bVar1) {
      if (pTVar2 == (this->u).local.typeWithoutProperty) {
        pvVar4 = DynamicObject::GetInlineSlot
                           ((this->u).proto.prototypeObject,(uint)(this->u).proto.slotIndex);
        bVar1 = TaggedNumber::Is(pvVar4);
        if (!bVar1) {
          pRVar5 = VarTo<Js::RecyclableObject>(pvVar4);
          *callee = pRVar5;
          return true;
        }
      }
      else if ((Type *)((ulong)pTVar2 | 4) == (this->u).local.typeWithoutProperty) {
        pvVar4 = DynamicObject::GetAuxSlot
                           ((this->u).proto.prototypeObject,(uint)(this->u).proto.slotIndex);
        bVar1 = TaggedNumber::Is(pvVar4);
        if (!bVar1) {
          pRVar5 = VarTo<Js::RecyclableObject>(pvVar4);
          *callee = pRVar5;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool InlineCache::GetCallApplyTarget(RecyclableObject* obj, RecyclableObject **callee)
    {
        Type *const type = obj->GetType();
        Type *const taggedType = TypeWithAuxSlotTag(type);
        *callee = nullptr;

        if (IsLocal())
        {
            if (type == u.local.type)
            {
                const Var objectAtInlineSlot = VarTo<DynamicObject>(obj)->GetInlineSlot(u.local.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtInlineSlot))
                {
                    *callee = VarTo<RecyclableObject>(objectAtInlineSlot);
                    return true;
                }
            }
            else if (taggedType == u.local.type)
            {
                const Var objectAtAuxSlot = VarTo<DynamicObject>(obj)->GetAuxSlot(u.local.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtAuxSlot))
                {
                    *callee = VarTo<RecyclableObject>(VarTo<DynamicObject>(obj)->GetAuxSlot(u.local.slotIndex));
                    return true;
                }
            }
            return false;
        }
        else if (IsProto())
        {
            if (type == u.proto.type)
            {
                const Var objectAtInlineSlot = u.proto.prototypeObject->GetInlineSlot(u.proto.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtInlineSlot))
                {
                    *callee = VarTo<RecyclableObject>(objectAtInlineSlot);
                    return true;
                }
            }
            else if (taggedType == u.proto.type)
            {
                const Var objectAtAuxSlot = u.proto.prototypeObject->GetAuxSlot(u.proto.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtAuxSlot))
                {
                    *callee = VarTo<RecyclableObject>(objectAtAuxSlot);
                    return true;
                }
            }
            return false;
        }
        return false;
    }